

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_builder.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::MessageBuilderGenerator::GenerateBuilderFieldParsingCases
          (MessageBuilderGenerator *this,Printer *printer)

{
  byte bVar1;
  FieldDescriptor *field;
  bool v1;
  FieldDescriptor **ppFVar2;
  Nonnull<const_char_*> failure_msg;
  long lVar3;
  LogMessageFatal local_40;
  
  ppFVar2 = SortFieldsByNumber(this->descriptor_);
  if (0 < this->descriptor_->field_count_) {
    lVar3 = 0;
    do {
      field = ppFVar2[lVar3];
      GenerateBuilderFieldParsingCase(this,printer,field);
      bVar1 = field->field_0x1;
      v1 = (bool)((bVar1 & 0x20) >> 5);
      if (0xbf < bVar1 == v1) {
        failure_msg = (Nonnull<const_char_*>)0x0;
      }
      else {
        failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (v1,0xbf < bVar1,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      }
      if (failure_msg != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb54,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
      }
      if (((field->field_0x1 & 0x20) != 0) && (field->type_ - 0xd < 0xfffffffc)) {
        GenerateBuilderPackedFieldParsingCase(this,printer,field);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < this->descriptor_->field_count_);
  }
  if (ppFVar2 == (FieldDescriptor **)0x0) {
    return;
  }
  operator_delete__(ppFVar2);
  return;
}

Assistant:

void MessageBuilderGenerator::GenerateBuilderFieldParsingCases(
    io::Printer* printer) {
  std::unique_ptr<const FieldDescriptor*[]> sorted_fields(
      SortFieldsByNumber(descriptor_));
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = sorted_fields[i];
    GenerateBuilderFieldParsingCase(printer, field);
    if (field->is_packable()) {
      GenerateBuilderPackedFieldParsingCase(printer, field);
    }
  }
}